

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.cpp
# Opt level: O0

void __thiscall
ot::commissioner::Job::Job
          (Job *this,Interpreter *aInterpreter,CommissionerAppPtr *aCommApp,Expression *aExpr,
          JobEvaluator *aEval,uint64_t aXpanId)

{
  uint64_t aXpanId_local;
  JobEvaluator *aEval_local;
  Expression *aExpr_local;
  CommissionerAppPtr *aCommApp_local;
  Interpreter *aInterpreter_local;
  Job *this_local;
  
  this->mInterpreter = aInterpreter;
  this->mCommissioner = aCommApp;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mExpr,aExpr);
  std::
  function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&this->mEval,aEval);
  Interpreter::Value::Value(&this->mValue);
  std::thread::thread(&this->mJobThread);
  this->mXpanId = aXpanId;
  return;
}

Assistant:

Job::Job(Interpreter              &aInterpreter,
         CommissionerAppPtr       &aCommApp,
         Interpreter::Expression   aExpr,
         Interpreter::JobEvaluator aEval,
         uint64_t                  aXpanId)
    : mInterpreter(aInterpreter)
    , mCommissioner(aCommApp)
    , mExpr(aExpr)
    , mEval(aEval)
    , mXpanId(aXpanId)
{
}